

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void decode_performance_tests(int loop_count)

{
  allocator<unsigned_char> *this;
  ostream *poVar1;
  size_t __n;
  rep rVar2;
  jpegls_error *e;
  failure *e_1;
  duration<double,_std::ratio<1L,_1000L>_> local_1a0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_198;
  type diff;
  time_point end;
  jpegls_decoder decoder;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_f0;
  int i;
  time_point start;
  jpegls_decoder local_e0;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> destination;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_source;
  int loop_count_local;
  
  encoded_source.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = loop_count;
  poVar1 = std::operator<<((ostream *)&std::cout,"Test decode performance with loop count ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,encoded_source.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::operator<<(poVar1,"\n");
  read_file((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,"decodetest.jls",0,0);
  charls::jpegls_decoder::
  jpegls_decoder<std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_char>
            (&local_e0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,true);
  __n = charls::jpegls_decoder::destination_size(&local_e0,0);
  this = (allocator<unsigned_char> *)((long)&start.__d.__r + 7);
  std::allocator<unsigned_char>::allocator(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,__n,this);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&start.__d.__r + 7));
  charls::jpegls_decoder::~jpegls_decoder(&local_e0);
  tStack_f0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (decoder.application_data_handler_._M_invoker._4_4_ = 0;
      decoder.application_data_handler_._M_invoker._4_4_ !=
      encoded_source.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_;
      decoder.application_data_handler_._M_invoker._4_4_ =
           decoder.application_data_handler_._M_invoker._4_4_ + 1) {
    charls::jpegls_decoder::
    jpegls_decoder<std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_char>
              ((jpegls_decoder *)&end,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,true);
    charls::jpegls_decoder::
    decode<std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_char>
              ((jpegls_decoder *)&end,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
    charls::jpegls_decoder::~jpegls_decoder((jpegls_decoder *)&end);
  }
  diff.__r = std::chrono::_V2::steady_clock::now();
  local_198.__r =
       (rep_conflict)
       std::chrono::operator-
                 ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&diff,&stack0xffffffffffffff10);
  poVar1 = std::operator<<((ostream *)&std::cout,"Total decoding time is: ");
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_1a0,&local_198);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_1a0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," ms\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Decoding time per image: ");
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&e_1,&local_198);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count
                    ((duration<double,_std::ratio<1L,_1000L>_> *)&e_1);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,rVar2 / (double)encoded_source.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _4_4_);
  std::operator<<(poVar1," ms\n");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

void decode_performance_tests(const int loop_count)
{
    cout << "Test decode performance with loop count " << loop_count << "\n";

    try
    {
        // This test expect the file decodetest.jls to exist.
        // It can be any valid JPEG-LS file.
        // Changing the content of this file allows different performance measurements.
        const vector<uint8_t> encoded_source{read_file("decodetest.jls")};

        // Pre-allocate the destination outside the measurement loop.
        // std::vector initializes its elements and this step needs to be excluded from the measurement.
        vector<uint8_t> destination(jpegls_decoder{encoded_source, true}.destination_size());

        const auto start{steady_clock::now()};
        for (int i{}; i != loop_count; ++i)
        {
            const jpegls_decoder decoder{encoded_source, true};

            decoder.decode(destination);
        }

        const auto end{steady_clock::now()};
        const auto diff{end - start};
        cout << "Total decoding time is: " << duration<double, milli>(diff).count() << " ms\n";
        cout << "Decoding time per image: " << duration<double, milli>(diff).count() / loop_count << " ms\n";
    }
    catch (const jpegls_error& e)
    {
        cout << "Decode failure: " << e.what() << "\n";
    }
    catch (const std::ios_base::failure& e)
    {
        cout << "IO failure (missing decodetest.jls?): " << e.what() << "\n";
    }
}